

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O0

void __thiscall despot::POMDPX::PrintModel(POMDPX *this,ostream *out)

{
  ostream *poVar1;
  void *pvVar2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_70;
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  local_58;
  vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_> local_30;
  ostream *local_18;
  ostream *out_local;
  POMDPX *this_local;
  
  local_18 = out;
  out_local = (ostream *)this;
  poVar1 = std::operator<<(out,"Parser pointer = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,this->parser_);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_18,"is_small = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(this->is_small_ & 1));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_18,"Min reward action = ");
  poVar1 = despot::operator<<(poVar1,&this->min_reward_action_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_18,"Max reward action = ");
  poVar1 = despot::operator<<(poVar1,&this->max_reward_action_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_18,"States = ");
  std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::vector
            (&local_30,&this->states_);
  poVar1 = despot::operator<<(poVar1,&local_30);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::~vector(&local_30);
  poVar1 = std::operator<<(local_18,"Transitions = ");
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::vector(&local_58,&this->transition_probabilities_);
  poVar1 = despot::operator<<(poVar1,&local_58);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::~vector(&local_58);
  poVar1 = std::operator<<(local_18,"Rewards = ");
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_70,&this->rewards_);
  poVar1 = despot::operator<<(poVar1,&local_70);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_70);
  poVar1 = std::operator<<(local_18,"MemoryPool = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,&this->memory_pool_);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void POMDPX::PrintModel(ostream& out) const {
	out << "Parser pointer = " << parser_ << endl;
	out << "is_small = " << is_small_ << endl;

	out << "Min reward action = " << min_reward_action_ << endl;
	out << "Max reward action = " << max_reward_action_ << endl;

	out << "States = " << states_ << endl;
	out << "Transitions = " << transition_probabilities_ << endl;
	out << "Rewards = " << rewards_ << endl;
	out << "MemoryPool = " << &memory_pool_ << endl;
}